

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_iterate(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bitset_t *pbVar7;
  long lVar8;
  long lVar9;
  bitset_t *pbVar10;
  long lVar11;
  long *in_RSI;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  ulong unaff_R13;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  ulong auStack_218 [4];
  bitset_t *pbStack_1f8;
  bitset_t *pbStack_1f0;
  code *pcStack_1e8;
  bitset_t *pbStack_1d8;
  undefined8 uStack_1d0;
  bitset_t *pbStack_1c8;
  code *pcStack_1c0;
  bitset_t *pbStack_1b0;
  bitset_t *pbStack_1a8;
  bitset_t *pbStack_1a0;
  ulong uStack_198;
  ulong uStack_190;
  bitset_t *pbStack_188;
  code *pcStack_180;
  bitset_t *pbStack_178;
  long lStack_170;
  ulong uStack_168;
  bitset_t *pbStack_160;
  code *pcStack_158;
  bitset_t *pbStack_148;
  ulong uStack_140;
  ulong uStack_138;
  bitset_t *pbStack_130;
  long lStack_128;
  code *pcStack_120;
  size_t sStack_118;
  long lStack_110;
  long lStack_108;
  bitset_t *pbStack_100;
  code *pcStack_f8;
  size_t sStack_f0;
  bitset_t *pbStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  bitset_t *pbStack_d0;
  size_t sStack_c8;
  long lStack_50;
  bitset_t *pbStack_48;
  
  uVar17 = 0;
  pbVar3 = bitset_create();
  do {
    uVar20 = uVar17 >> 6;
    if (uVar20 < pbVar3->arraysize) {
LAB_001018f9:
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
    }
    else {
      in_RSI = (long *)(uVar20 + 1);
      _Var2 = bitset_grow(pbVar3,(size_t)in_RSI);
      if (_Var2) goto LAB_001018f9;
    }
    uVar17 = uVar17 + 3;
  } while (uVar17 != 3000);
  pbVar7 = pbVar3;
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 1000) {
    uVar17 = 0;
    uVar20 = 0;
    do {
      uVar12 = uVar17 >> 6;
      if (uVar12 < pbVar3->arraysize) {
        pbVar7 = (bitset_t *)pbVar3->array;
        uVar13 = (ulong)(&pbVar7->array)[uVar12] >> ((byte)uVar17 & 0x3f);
        if (uVar13 == 0) {
          lVar8 = uVar12 * -0x40;
          uVar12 = uVar12 + 1;
          do {
            if (pbVar3->arraysize == uVar12) goto LAB_00101986;
            puVar1 = (&pbVar7->array)[uVar12];
            lVar8 = lVar8 + -0x40;
            uVar12 = uVar12 + 1;
          } while (puVar1 == (uint64_t *)0x0);
          lVar16 = 0;
          if (puVar1 != (uint64_t *)0x0) {
            for (; ((ulong)puVar1 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar17 = lVar16 - lVar8;
        }
        else {
          uVar12 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar17 = uVar17 + uVar12;
        }
        in_RSI = (long *)CONCAT71((int7)(uVar12 >> 8),1);
      }
      else {
LAB_00101986:
        in_RSI = (long *)0x0;
      }
      if ((char)in_RSI == '\0') {
        if (uVar20 == 3000) {
          bitset_free(pbVar3);
          return;
        }
        goto LAB_001019bb;
      }
      if (uVar17 != uVar20) goto LAB_001019b1;
      uVar20 = uVar20 + 3;
      uVar17 = uVar17 + 1;
    } while( true );
  }
LAB_001019b6:
  test_iterate_cold_1();
LAB_001019bb:
  test_iterate_cold_2();
  if ((bitset_t *)*in_RSI == pbVar7) {
    *in_RSI = (long)((long)&((bitset_t *)*in_RSI)->array + 3);
    return;
  }
  increment_cold_1();
  uVar17 = 0;
  pbStack_48 = pbVar3;
  pbVar3 = bitset_create();
  do {
    uVar20 = uVar17 >> 6;
    if ((uVar20 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar20 + 1), _Var2)) {
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
    }
    uVar17 = uVar17 + 3;
  } while (uVar17 != 3000);
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 1000) {
    lStack_50 = 0;
    if (pbVar3->arraysize != 0) {
      lVar8 = 0;
      uVar17 = 0;
      do {
        uVar15 = pbVar3->array[uVar17];
        do {
          unaff_R13 = uVar15;
          if (unaff_R13 == 0) {
            lVar8 = lVar8 + 0x40;
            break;
          }
          lVar16 = 0;
          if (unaff_R13 != 0) {
            for (; (unaff_R13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          _Var2 = increment(lVar16 + lVar8,&lStack_50);
          if (_Var2) {
            uVar20 = unaff_R13 - 1;
          }
          else {
            uVar20 = 0xffffffffffffffff;
          }
          uVar15 = uVar20 & unaff_R13;
        } while (_Var2);
      } while ((unaff_R13 == 0) && (uVar17 = uVar17 + 1, uVar17 < pbVar3->arraysize));
    }
    if (lStack_50 == 3000) {
      bitset_free(pbVar3);
      return;
    }
  }
  else {
    test_iterate2_cold_1();
  }
  test_iterate2_cold_2();
  uVar17 = 0;
  pbVar3 = bitset_create();
  do {
    uVar20 = uVar17 >> 6;
    if ((uVar20 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar20 + 1), _Var2)) {
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
    }
    uVar17 = uVar17 + 3;
  } while (uVar17 != 3000);
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 1000) {
    uVar17 = 0;
    while( true ) {
      if (uVar17 >> 6 < pbVar3->arraysize) {
        bVar21 = (pbVar3->array[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0;
      }
      else {
        bVar21 = false;
      }
      if (((int)uVar17 != (int)((uVar17 & 0xffffffff) / 3) * 3) == bVar21) break;
      uVar17 = uVar17 + 1;
      if (uVar17 == 3000) {
        bitset_free(pbVar3);
        return;
      }
    }
    test_construct_cold_2();
  }
  test_construct_cold_1();
  uVar17 = 300;
  pbVar3 = bitset_create();
  while( true ) {
    uVar20 = uVar17 >> 6;
    if ((uVar20 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar20 + 1), _Var2)) {
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
    }
    sVar4 = bitset_minimum(pbVar3);
    if (sVar4 != 300) break;
    sVar4 = bitset_maximum(pbVar3);
    if (uVar17 != sVar4) {
      test_max_min_cold_2();
      break;
    }
    uVar17 = uVar17 + 3;
    if (uVar17 == 3000) {
      bitset_free(pbVar3);
      return;
    }
  }
  test_max_min_cold_1();
  sVar4 = 0;
  while( true ) {
    uVar17 = 300;
    pbVar3 = bitset_create();
    do {
      uVar20 = uVar17 >> 6;
      if ((uVar20 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar20 + 1), _Var2)) {
        pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
      }
      uVar17 = uVar17 + 3;
    } while (uVar17 != 15000);
    sVar5 = bitset_count(pbVar3);
    bitset_shift_left(pbVar3,sVar4);
    sVar6 = bitset_count(pbVar3);
    if (sVar6 != sVar5) break;
    lVar8 = 300;
    do {
      uVar17 = sVar4 + lVar8 >> 6;
      if ((pbVar3->arraysize <= uVar17) ||
         ((pbVar3->array[uVar17] >> (sVar4 + lVar8 & 0x3f) & 1) == 0)) {
        test_shift_left_cold_2();
        goto LAB_00101ce7;
      }
      lVar8 = lVar8 + 3;
    } while (lVar8 != 15000);
    bitset_free(pbVar3);
    sVar4 = sVar4 + 1;
    if (sVar4 == 0x100) {
      return;
    }
  }
LAB_00101ce7:
  test_shift_left_cold_1();
  pbVar7 = bitset_create();
  if ((pbVar7->arraysize != 0) || (_Var2 = bitset_grow(pbVar7,1), _Var2)) {
    *pbVar7->array = *pbVar7->array | 2;
  }
  if ((pbVar7->arraysize != 0) || (_Var2 = bitset_grow(pbVar7,1), _Var2)) {
    *pbVar7->array = *pbVar7->array & 0xfffffffffffffffd;
  }
  if ((pbVar7->arraysize != 0) || (_Var2 = bitset_grow(pbVar7,1), _Var2)) {
    *pbVar7->array = *pbVar7->array & 0xfffffffffffffbff;
  }
  if ((pbVar7->arraysize != 0) || (_Var2 = bitset_grow(pbVar7,1), _Var2)) {
    *pbVar7->array = *pbVar7->array | 0x400;
  }
  if ((pbVar7->arraysize == 0) || ((*pbVar7->array & 0x400) == 0)) {
    test_set_to_val_cold_2();
  }
  else if ((pbVar7->arraysize == 0) || ((*pbVar7->array & 2) == 0)) {
    bitset_free(pbVar7);
    return;
  }
  test_set_to_val_cold_1();
  lVar8 = 0;
  lVar16 = 0;
  sStack_f0 = 0;
  pbStack_e8 = pbVar7;
  uStack_e0 = uVar20;
  uStack_d8 = unaff_R13;
  pbStack_d0 = pbVar3;
  sStack_c8 = sVar5;
  do {
    lVar11 = 300;
    pcStack_f8 = (code *)0x101dca;
    pbVar3 = bitset_create();
    do {
      uVar17 = (ulong)(lVar16 + lVar11) >> 6;
      if (uVar17 < pbVar3->arraysize) {
LAB_00101df0:
        pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)(lVar16 + lVar11) & 0x3f);
      }
      else {
        pcStack_f8 = (code *)0x101dec;
        _Var2 = bitset_grow(pbVar3,uVar17 + 1);
        if (_Var2) goto LAB_00101df0;
      }
      lVar11 = lVar11 + 3;
    } while (lVar11 != 0x3bc4);
    pcStack_f8 = (code *)0x101e16;
    sVar5 = bitset_count(pbVar3);
    sVar4 = sStack_f0;
    pcStack_f8 = (code *)0x101e28;
    bitset_shift_right(pbVar3,sStack_f0);
    pcStack_f8 = (code *)0x101e30;
    sVar6 = bitset_count(pbVar3);
    if (sVar6 != sVar5) {
LAB_00101e9c:
      pcStack_f8 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_118 = sVar4;
      pcStack_120 = (code *)0x101eaf;
      lStack_110 = lVar8;
      lStack_108 = lVar16;
      pbStack_100 = pbVar3;
      pcStack_f8 = (code *)sVar5;
      pbVar3 = bitset_create();
      lVar8 = 0;
      pcStack_120 = (code *)0x101eba;
      pbVar7 = bitset_create();
      uVar17 = 0;
      goto LAB_00101ec0;
    }
    lVar9 = 300;
    do {
      uVar17 = (ulong)(lVar8 + lVar9) >> 6;
      if ((pbVar3->arraysize <= uVar17) ||
         ((pbVar3->array[uVar17] >> (lVar8 + lVar9 & 0x3fU) & 1) == 0)) {
        pcStack_f8 = (code *)0x101e9c;
        test_shift_right_cold_2();
        goto LAB_00101e9c;
      }
      lVar9 = lVar9 + 3;
    } while (lVar9 != 0x3bc4);
    pcStack_f8 = (code *)0x101e70;
    bitset_free(pbVar3);
    sStack_f0 = sVar4 + 1;
    lVar16 = lVar16 + 3;
    lVar8 = lVar8 + 2;
    if (sStack_f0 == 0x100) {
      return;
    }
  } while( true );
LAB_001019b1:
  test_iterate_cold_3();
  goto LAB_001019b6;
  while( true ) {
    uVar17 = uVar17 + 1;
    lVar8 = lVar8 + 2;
    if (uVar17 == 1000) break;
LAB_00101ec0:
    uVar20 = uVar17 >> 5;
    if (uVar20 < pbVar3->arraysize) {
LAB_00101edd:
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)lVar8 & 0x3e);
    }
    else {
      pcStack_120 = (code *)0x101ed9;
      _Var2 = bitset_grow(pbVar3,uVar20 + 1);
      if (_Var2) goto LAB_00101edd;
    }
    if (uVar20 < pbVar7->arraysize) {
LAB_00101f08:
      pbVar7->array[uVar20] = pbVar7->array[uVar20] | 2L << ((byte)lVar8 & 0x3e);
    }
    else {
      pcStack_120 = (code *)0x101f04;
      _Var2 = bitset_grow(pbVar7,uVar20 + 1);
      if (_Var2) goto LAB_00101f08;
    }
  }
  pcStack_120 = (code *)0x101f38;
  bitset_inplace_symmetric_difference(pbVar3,pbVar7);
  pcStack_120 = (code *)0x101f40;
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 2000) {
    pcStack_120 = (code *)0x101f57;
    bitset_inplace_symmetric_difference(pbVar3,pbVar7);
    pcStack_120 = (code *)0x101f5f;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102019;
    pcStack_120 = (code *)0x101f76;
    bitset_inplace_difference(pbVar3,pbVar7);
    pcStack_120 = (code *)0x101f7e;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_0010201e;
    pcStack_120 = (code *)0x101f95;
    bitset_inplace_union(pbVar3,pbVar7);
    pcStack_120 = (code *)0x101f9d;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 2000) goto LAB_00102023;
    pcStack_120 = (code *)0x101fb0;
    bitset_inplace_intersection(pbVar3,pbVar7);
    pcStack_120 = (code *)0x101fb8;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102028;
    pcStack_120 = (code *)0x101fcb;
    bitset_inplace_difference(pbVar3,pbVar7);
    pcStack_120 = (code *)0x101fd3;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 0) goto LAB_0010202d;
    pcStack_120 = (code *)0x101fe3;
    bitset_inplace_union(pbVar3,pbVar7);
    pcStack_120 = (code *)0x101fee;
    bitset_inplace_difference(pbVar7,pbVar3);
    pcStack_120 = (code *)0x101ff6;
    sVar4 = bitset_count(pbVar7);
    if (sVar4 == 0) {
      pcStack_120 = (code *)0x102003;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_120 = (code *)0x102019;
    test_union_intersection_cold_1();
LAB_00102019:
    pcStack_120 = (code *)0x10201e;
    test_union_intersection_cold_2();
LAB_0010201e:
    pcStack_120 = (code *)0x102023;
    test_union_intersection_cold_3();
LAB_00102023:
    pcStack_120 = (code *)0x102028;
    test_union_intersection_cold_4();
LAB_00102028:
    pcStack_120 = (code *)0x10202d;
    test_union_intersection_cold_5();
LAB_0010202d:
    pcStack_120 = (code *)0x102032;
    test_union_intersection_cold_6();
  }
  pcStack_120 = test_counts;
  test_union_intersection_cold_7();
  pcStack_158 = (code *)0x102047;
  pbStack_148 = pbVar3;
  uStack_140 = uVar17;
  uStack_138 = uVar20;
  pbStack_130 = pbVar7;
  lStack_128 = lVar8;
  pcStack_120 = (code *)lVar11;
  pbVar3 = bitset_create();
  lVar8 = 0;
  pcStack_158 = (code *)0x102052;
  pbVar7 = bitset_create();
  uVar20 = 0;
  uVar17 = 0;
  do {
    uVar12 = uVar17 >> 5;
    if (uVar12 < pbVar3->arraysize) {
LAB_00102078:
      pbVar3->array[uVar12] = pbVar3->array[uVar12] | 1L << ((byte)lVar8 & 0x3e);
    }
    else {
      pcStack_158 = (code *)0x102074;
      _Var2 = bitset_grow(pbVar3,uVar12 + 1);
      if (_Var2) goto LAB_00102078;
    }
    uVar12 = uVar20 >> 6;
    if (uVar12 < pbVar7->arraysize) {
LAB_001020aa:
      pbVar7->array[uVar12] = pbVar7->array[uVar12] | 1L << ((byte)uVar20 & 0x3f);
    }
    else {
      pcStack_158 = (code *)0x1020a6;
      _Var2 = bitset_grow(pbVar7,uVar12 + 1);
      if (_Var2) goto LAB_001020aa;
    }
    uVar17 = uVar17 + 1;
    uVar20 = uVar20 + 3;
    lVar8 = lVar8 + 2;
  } while (uVar17 != 1000);
  pcStack_158 = (code *)0x1020db;
  sVar4 = bitset_intersection_count(pbVar3,pbVar7);
  if (sVar4 == 0x14e) {
    pcStack_158 = (code *)0x1020ee;
    sVar4 = bitset_union_count(pbVar3,pbVar7);
    if (sVar4 == 0x682) {
      pcStack_158 = (code *)0x1020fe;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_158 = (code *)0x102119;
    test_counts_cold_1();
  }
  pcStack_158 = test_disjoint;
  test_counts_cold_2();
  pcStack_180 = (code *)0x10212c;
  pbStack_178 = pbVar3;
  lStack_170 = lVar8;
  uStack_168 = uVar17;
  pbStack_160 = pbVar7;
  pcStack_158 = (code *)uVar20;
  pbVar3 = bitset_create();
  uVar17 = 0;
  pcStack_180 = (code *)0x102137;
  pbVar7 = bitset_create();
  do {
    uVar20 = uVar17 >> 6;
    if ((uVar17 & 1) == 0) {
      uVar12 = 0x3e;
      pbVar10 = pbVar3;
      if (uVar20 < pbVar3->arraysize) goto LAB_0010218d;
      pcStack_180 = (code *)0x102175;
      _Var2 = bitset_grow(pbVar3,uVar20 + 1);
LAB_00102189:
      if (_Var2 != false) goto LAB_0010218d;
    }
    else {
      uVar12 = 0x3f;
      pbVar10 = pbVar7;
      if (pbVar7->arraysize <= uVar20) {
        pcStack_180 = (code *)0x102186;
        _Var2 = bitset_grow(pbVar7,uVar20 + 1);
        goto LAB_00102189;
      }
LAB_0010218d:
      uVar19 = (uint)uVar12 & (uint)uVar17;
      uVar12 = (ulong)uVar19;
      pbVar10->array[uVar20] = pbVar10->array[uVar20] | 1L << (sbyte)uVar19;
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 1000);
  pcStack_180 = (code *)0x1021b9;
  _Var2 = bitsets_disjoint(pbVar3,pbVar7);
  if (_Var2) {
    uVar12 = 0x20000000000000;
    if (pbVar3->arraysize < 8) {
      pcStack_180 = (code *)0x1021db;
      _Var2 = bitset_grow(pbVar3,8);
      if (_Var2) goto LAB_001021df;
    }
    else {
LAB_001021df:
      pbVar3->array[7] = pbVar3->array[7] | 0x20000000000000;
    }
    if (pbVar7->arraysize < 8) {
      pcStack_180 = (code *)0x1021fa;
      _Var2 = bitset_grow(pbVar7,8);
      if (_Var2) goto LAB_001021fe;
    }
    else {
LAB_001021fe:
      pbVar7->array[7] = pbVar7->array[7] | 0x20000000000000;
    }
    pcStack_180 = (code *)0x102210;
    _Var2 = bitsets_disjoint(pbVar3,pbVar7);
    if (!_Var2) {
      pcStack_180 = (code *)0x10221c;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_180 = (code *)0x102232;
    test_disjoint_cold_1();
  }
  pcStack_180 = test_intersects;
  test_disjoint_cold_2();
  pbStack_1a8 = (bitset_t *)0x102245;
  pbStack_1a0 = pbVar3;
  uStack_198 = uVar17;
  uStack_190 = uVar20;
  pbStack_188 = pbVar7;
  pcStack_180 = (code *)uVar12;
  pbVar3 = bitset_create();
  pbStack_1a8 = (bitset_t *)0x10224d;
  pbVar7 = bitset_create();
  pbStack_1a8 = (bitset_t *)0x102258;
  _Var2 = bitset_empty(pbVar3);
  if (_Var2) {
    uVar17 = 0;
    do {
      uVar20 = uVar17 >> 6;
      if ((uVar17 & 1) == 0) {
        uVar12 = 0x3e;
        pbVar10 = pbVar3;
        if (uVar20 < pbVar3->arraysize) goto LAB_001022b6;
        pbStack_1a8 = (bitset_t *)0x10229e;
        _Var2 = bitset_grow(pbVar3,uVar20 + 1);
LAB_001022b2:
        if (_Var2 != false) goto LAB_001022b6;
      }
      else {
        uVar12 = 0x3f;
        pbVar10 = pbVar7;
        if (pbVar7->arraysize <= uVar20) {
          pbStack_1a8 = (bitset_t *)0x1022af;
          _Var2 = bitset_grow(pbVar7,uVar20 + 1);
          goto LAB_001022b2;
        }
LAB_001022b6:
        uVar19 = (uint)uVar12 & (uint)uVar17;
        uVar12 = (ulong)uVar19;
        pbVar10->array[uVar20] = pbVar10->array[uVar20] | 1L << (sbyte)uVar19;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != 1000);
    pbStack_1a8 = (bitset_t *)0x1022e2;
    _Var2 = bitsets_intersect(pbVar3,pbVar7);
    if (_Var2) goto LAB_0010235b;
    uVar12 = 0x20000000000;
    if (pbVar3->arraysize < 0x10) {
      pbStack_1a8 = (bitset_t *)0x102304;
      _Var2 = bitset_grow(pbVar3,0x10);
      if (_Var2) goto LAB_00102308;
    }
    else {
LAB_00102308:
      pbVar3->array[0xf] = pbVar3->array[0xf] | 0x20000000000;
    }
    if (pbVar7->arraysize < 0x10) {
      pbStack_1a8 = (bitset_t *)0x102323;
      _Var2 = bitset_grow(pbVar7,0x10);
      if (_Var2) goto LAB_00102327;
    }
    else {
LAB_00102327:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pbStack_1a8 = (bitset_t *)0x102339;
    _Var2 = bitsets_intersect(pbVar3,pbVar7);
    if (_Var2) {
      pbStack_1a8 = (bitset_t *)0x102345;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pbStack_1a8 = (bitset_t *)0x10235b;
    test_intersects_cold_1();
LAB_0010235b:
    pbStack_1a8 = (bitset_t *)0x102360;
    test_intersects_cold_3();
  }
  pbStack_1a8 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_1c0 = (code *)0x102373;
  pbStack_1b0 = pbVar3;
  pbStack_1a8 = pbVar7;
  pbVar3 = bitset_create_with_capacity(10);
  pcStack_1c0 = (code *)0x102380;
  pbVar7 = bitset_create_with_capacity(5);
  if (pbVar3->arraysize == 0) {
    pcStack_1c0 = (code *)0x102397;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_0010239b;
  }
  else {
LAB_0010239b:
    *pbVar3->array = *pbVar3->array | 2;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_1c0 = (code *)0x1023b6;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023ba;
  }
  else {
LAB_001023ba:
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_1c0 = (code *)0x1023d5;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023d9;
  }
  else {
LAB_001023d9:
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_1c0 = (code *)0x1023f4;
    _Var2 = bitset_grow(pbVar7,1);
    if (_Var2) goto LAB_001023f8;
  }
  else {
LAB_001023f8:
    *pbVar7->array = *pbVar7->array | 2;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_1c0 = (code *)0x102413;
    _Var2 = bitset_grow(pbVar7,1);
    if (_Var2) goto LAB_00102417;
  }
  else {
LAB_00102417:
    *pbVar7->array = *pbVar7->array | 0x10;
  }
  pcStack_1c0 = (code *)0x102429;
  _Var2 = bitset_contains_all(pbVar3,pbVar7);
  if (_Var2) {
    pcStack_1c0 = (code *)0x102438;
    _Var2 = bitset_contains_all(pbVar7,pbVar3);
    if (!_Var2) {
      pcStack_1c0 = (code *)0x102444;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x102458;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_1c0 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_1e8 = (code *)0x10246a;
  pbStack_1d8 = pbVar3;
  uStack_1d0 = 1000;
  pbStack_1c8 = pbVar7;
  pcStack_1c0 = (code *)uVar12;
  pbVar3 = bitset_create();
  uVar17 = 0;
  pcStack_1e8 = (code *)0x102475;
  pbVar7 = bitset_create();
  do {
    uVar20 = uVar17 >> 6;
    if (uVar20 < pbVar3->arraysize) {
LAB_00102496:
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
    }
    else {
      pcStack_1e8 = (code *)0x102492;
      _Var2 = bitset_grow(pbVar3,uVar20 + 1);
      if (_Var2) goto LAB_00102496;
    }
    if ((uVar17 & 1) == 0) {
      if (pbVar7->arraysize <= uVar20) {
        pcStack_1e8 = (code *)0x1024c1;
        _Var2 = bitset_grow(pbVar7,uVar20 + 1);
        if (!_Var2) goto LAB_001024da;
      }
      pbVar7->array[uVar20] = pbVar7->array[uVar20] | 1L << ((byte)uVar17 & 0x3e);
    }
LAB_001024da:
    uVar17 = uVar17 + 1;
  } while (uVar17 != 1000);
  pcStack_1e8 = (code *)0x1024f1;
  _Var2 = bitset_contains_all(pbVar3,pbVar7);
  if (_Var2) {
    pcStack_1e8 = (code *)0x102500;
    _Var2 = bitset_contains_all(pbVar7,pbVar3);
    if (_Var2) goto LAB_0010256b;
    if (pbVar7->arraysize < 0x10) {
      pcStack_1e8 = (code *)0x102518;
      _Var2 = bitset_grow(pbVar7,0x10);
      if (_Var2) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pcStack_1e8 = (code *)0x102538;
    _Var2 = bitset_contains_all(pbVar3,pbVar7);
    if (!_Var2) {
      pcStack_1e8 = (code *)0x102547;
      _Var2 = bitset_contains_all(pbVar7,pbVar3);
      if (!_Var2) {
        pcStack_1e8 = (code *)0x102553;
        bitset_free(pbVar3);
        bitset_free(pbVar7);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_1e8 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_1e8 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_1e8 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_1e8 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar20 = 0;
  pbStack_1f8 = pbVar3;
  pbStack_1f0 = pbVar7;
  pcStack_1e8 = (code *)uVar17;
  pbVar3 = bitset_create();
  do {
    uVar17 = uVar20 >> 6;
    if (uVar17 < pbVar3->arraysize) {
LAB_001025ab:
      pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)uVar20 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar17 + 1);
      if (_Var2) goto LAB_001025ab;
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != 100);
  uVar17 = 0x3e6;
  do {
    uVar17 = uVar17 + 2;
    uVar20 = uVar17 >> 6;
    if (uVar20 < pbVar3->arraysize) {
LAB_001025ed:
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar20 + 1);
      if (_Var2) goto LAB_001025ed;
    }
  } while (uVar17 < 0x44a);
  uVar17 = pbVar3->arraysize;
  uVar20 = 0;
  lVar8 = 0;
LAB_0010261a:
  uVar12 = uVar20 >> 6;
  if (uVar12 < uVar17) {
    puVar1 = pbVar3->array;
    uVar15 = (puVar1[uVar12] >> ((byte)uVar20 & 0x3f)) << ((byte)uVar20 & 0x3f);
    uVar14 = uVar20 & 0xffffffffffffffc0;
    uVar13 = 0;
    do {
      while (uVar15 == 0) {
        uVar12 = uVar12 + 1;
        if (uVar12 == uVar17) goto LAB_0010268b;
        uVar14 = uVar14 + 0x40;
        uVar15 = puVar1[uVar12];
        if (2 < uVar13) goto LAB_0010268b;
      }
      uVar18 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      auStack_218[uVar13] = uVar18 | uVar14;
      uVar18 = uVar15 - 1;
      if (uVar13 == 2) {
        uVar18 = 0xffffffffffffffff;
      }
      uVar13 = uVar13 + 1;
      uVar15 = uVar15 & uVar18;
    } while (uVar13 != 3);
    uVar13 = 3;
LAB_0010268b:
    if (uVar13 != 0) {
      uVar20 = auStack_218[uVar13 - 1];
    }
  }
  else {
    uVar13 = 0;
  }
  if (uVar13 != 0) {
    uVar12 = lVar8 * 2 + 800;
    uVar14 = 0;
    do {
      uVar18 = lVar8 + uVar14;
      if (99 < lVar8 + uVar14) {
        uVar18 = uVar12;
      }
      if (auStack_218[uVar14] != uVar18) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar14 = uVar14 + 1;
      uVar12 = uVar12 + 2;
    } while (uVar13 != uVar14);
    uVar20 = uVar20 + 1;
    lVar8 = uVar13 + lVar8;
    goto LAB_0010261a;
  }
  if (lVar8 == 0x96) {
    bitset_free(pbVar3);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar17 = 0;
  pbVar3 = bitset_create();
  do {
    uVar20 = uVar17 >> 6;
    if ((uVar20 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar20 + 1), _Var2)) {
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3f);
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100);
  uVar17 = 0x3e6;
  do {
    uVar17 = uVar17 + 2;
    uVar20 = uVar17 >> 6;
    if ((uVar20 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar20 + 1), _Var2)) {
      pbVar3->array[uVar20] = pbVar3->array[uVar20] | 1L << ((byte)uVar17 & 0x3e);
    }
  } while (uVar17 < 0x44a);
  uVar17 = 0;
  uVar20 = 0;
  do {
    uVar12 = uVar17 >> 6;
    if (uVar12 < pbVar3->arraysize) {
      uVar13 = pbVar3->array[uVar12] >> ((byte)uVar17 & 0x3f);
      if (uVar13 == 0) {
        lVar8 = uVar12 * -0x40;
        do {
          uVar12 = uVar12 + 1;
          if (pbVar3->arraysize == uVar12) goto LAB_001027e0;
          uVar13 = pbVar3->array[uVar12];
          lVar8 = lVar8 + -0x40;
        } while (uVar13 == 0);
        lVar16 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        uVar17 = lVar16 - lVar8;
      }
      else {
        lVar8 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar17 = uVar17 + lVar8;
      }
      bVar21 = true;
    }
    else {
LAB_001027e0:
      bVar21 = false;
    }
    if (!bVar21) {
      if (uVar20 == 0x96) {
        bitset_free(pbVar3);
        return;
      }
      goto LAB_00102822;
    }
    uVar12 = uVar20 * 2 + 800;
    if (uVar20 < 100) {
      uVar12 = uVar20;
    }
    if (uVar17 != uVar12) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar20 = uVar20 + 1;
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void test_iterate() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  size_t k = 0;
  for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
    TEST_ASSERT(i == k);
    k += 3;
  }
  TEST_ASSERT(k == 3000);
  bitset_free(b);
}